

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::setUniformsRandom
          (ProgramBinaryUniformResetCase *this,ShaderProgram *program)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  GLuint program_00;
  GLint location;
  GLint location_00;
  GLint location_01;
  deUint32 dVar1;
  float fVar2;
  MessageBuilder local_1b0;
  
  local_1b0.m_log =
       ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  program_00 = (program->m_program).m_program;
  this_01 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,"Setting uniforms to random non-zero values.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  this_00 = &(this->super_ProgramBinaryCase).super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,program_00);
  location = glu::CallLogWrapper::glGetUniformLocation(this_00,program_00,"u_boolVar");
  location_00 = glu::CallLogWrapper::glGetUniformLocation(this_00,program_00,"u_intVar");
  location_01 = glu::CallLogWrapper::glGetUniformLocation(this_00,program_00,"u_floatVar");
  dVar1 = deRandom_getUint32(&(this->m_rnd).m_rnd);
  fVar2 = deRandom_getFloat(&(this->m_rnd).m_rnd);
  glu::CallLogWrapper::glUniform1i(this_00,location,1);
  glu::CallLogWrapper::glUniform1f(this_00,location_01,fVar2 * 999.0 + 1.0);
  glu::CallLogWrapper::glUniform1i(this_00,location_00,dVar1 % 1000 + 1);
  return;
}

Assistant:

void setUniformsRandom (glu::ShaderProgram& program)
	{
		TestLog&		log		= m_testCtx.getLog();
		const deUint32	glProg	= program.getProgram();

		log << TestLog::Message << "Setting uniforms to random non-zero values." << TestLog::EndMessage;

		glUseProgram(glProg);

		{
			const GLint		boolLoc		= glGetUniformLocation(glProg, "u_boolVar");
			const GLint		intLoc		= glGetUniformLocation(glProg, "u_intVar");
			const GLint		floatLoc	= glGetUniformLocation(glProg, "u_floatVar");

			const deInt32	intVal		= m_rnd.getInt(1, 1000);
			const float		floatVal	= m_rnd.getFloat(1.0, 1000.0);

			glUniform1i(boolLoc,	GL_TRUE);
			glUniform1f(floatLoc,	floatVal);
			glUniform1i(intLoc,		intVal);
		}
	}